

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPool.c
# Opt level: O3

void sbfPool_showSummary(sbfLog log,sbfLogLevel level)

{
  sbfPoolCountImpl *psVar1;
  sbfPoolCountTree *psVar2;
  sbfPoolCountImpl *elm;
  char tmp [64];
  
  sbfLog_log(log,level,"%-30s %6s%6s%11s%11s","Pool -------------------------","Pools","Size","Get",
             "New");
  pthread_mutex_lock((pthread_mutex_t *)&gSbfPoolCountMutex);
  psVar2 = &gSbfPoolCountTree;
  psVar1 = (sbfPoolCountImpl *)0x0;
  do {
    elm = psVar1;
    psVar1 = ((anon_struct_32_4_548b78d9_for_mTreeEntry *)psVar2)->rbe_left;
    psVar2 = (sbfPoolCountTree *)&psVar1->mTreeEntry;
  } while (psVar1 != (sbfPoolCountImpl *)0x0);
  for (; elm != (sbfPoolCountImpl *)0x0; elm = sbfPoolCountTreeImpl_RB_NEXT(elm)) {
    if (elm->mGets != 0) {
      snprintf(tmp,0x40,"%s:%u",elm->mFunction,(ulong)elm->mLine);
      sbfLog_log(log,level,"%-30.30s %6u%6zu%11u%11u",tmp,(ulong)elm->mPools,elm->mSize,
                 (ulong)elm->mGets,(ulong)elm->mNews);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&gSbfPoolCountMutex);
  return;
}

Assistant:

void
sbfPool_showSummary (sbfLog log, sbfLogLevel level)
{
    sbfPoolCount count;
    char         tmp[64];

    sbfLog_log (log,
                level,
                "%-30s %6s%6s%11s%11s",
                "Pool -------------------------",
                "Pools",
                "Size",
                "Get",
                "New");
    sbfMutex_lock (&gSbfPoolCountMutex);
    RB_FOREACH (count, sbfPoolCountTreeImpl, &gSbfPoolCountTree)
    {
        if (count->mGets != 0)
        {
            snprintf (tmp,
                      sizeof tmp,
                      "%s:%u",
                      count->mFunction,
                      count->mLine);

            sbfLog_log (log,
                        level,
                        "%-30.30s %6u%6zu%11u%11u",
                        tmp,
                        count->mPools,
                        count->mSize,
                        count->mGets,
                        count->mNews);
        }
    }
    sbfMutex_unlock (&gSbfPoolCountMutex);
}